

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_inout_fragment_outputs_copy_to_subpass_inputs(CompilerGLSL *this)

{
  pointer ppVar1;
  bool bVar2;
  SPIRVariable *pSVar3;
  SPIRVariable *pSVar4;
  SPIRType *type;
  SPIREntryPoint *pSVar5;
  SPIRFunction *pSVar6;
  CompilerError *this_00;
  pointer ppVar7;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  ppVar7 = (this->subpass_to_framebuffer_fetch_attachment).
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->subpass_to_framebuffer_fetch_attachment).
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar7 == ppVar1) {
      return;
    }
    pSVar3 = find_subpass_input_by_attachment_index(this,ppVar7->first);
    pSVar4 = find_color_output_by_location(this,ppVar7->second);
    if (pSVar3 != (SPIRVariable *)0x0) {
      if (pSVar4 == (SPIRVariable *)0x0) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,
                   "Need to declare the corresponding fragment output variable to be able to read from it."
                  );
LAB_0027a8af:
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      type = Compiler::get<spirv_cross::SPIRType>
                       (&this->super_Compiler,*(uint32_t *)&(pSVar4->super_IVariant).field_0xc);
      bVar2 = Compiler::is_array(&this->super_Compiler,type);
      if (bVar2) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,
                   "Cannot use GL_EXT_shader_framebuffer_fetch with arrays of color outputs.");
        goto LAB_0027a8af;
      }
      pSVar5 = Compiler::get_entry_point(&this->super_Compiler);
      pSVar6 = Compiler::get<spirv_cross::SPIRFunction>(&this->super_Compiler,(pSVar5->self).id);
      local_48 = (code *)0x0;
      pcStack_40 = (code *)0x0;
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      local_58._M_unused._M_object = operator_new(0x18);
      *(CompilerGLSL **)local_58._M_unused._0_8_ = this;
      *(SPIRVariable **)((long)local_58._M_unused._0_8_ + 8) = pSVar3;
      *(SPIRVariable **)((long)local_58._M_unused._0_8_ + 0x10) = pSVar4;
      pcStack_40 = ::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_glsl.cpp:18993:33)>
                   ::_M_invoke;
      local_48 = ::std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_glsl.cpp:18993:33)>
                 ::_M_manager;
      SmallVector<std::function<void_()>,_0UL>::push_back
                (&pSVar6->fixup_hooks_in,(function<void_()> *)&local_58);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_58);
    }
    ppVar7 = ppVar7 + 1;
  } while( true );
}

Assistant:

void CompilerGLSL::emit_inout_fragment_outputs_copy_to_subpass_inputs()
{
	for (auto &remap : subpass_to_framebuffer_fetch_attachment)
	{
		auto *subpass_var = find_subpass_input_by_attachment_index(remap.first);
		auto *output_var = find_color_output_by_location(remap.second);
		if (!subpass_var)
			continue;
		if (!output_var)
			SPIRV_CROSS_THROW("Need to declare the corresponding fragment output variable to be able "
			                  "to read from it.");
		if (is_array(get<SPIRType>(output_var->basetype)))
			SPIRV_CROSS_THROW("Cannot use GL_EXT_shader_framebuffer_fetch with arrays of color outputs.");

		auto &func = get<SPIRFunction>(get_entry_point().self);
		func.fixup_hooks_in.push_back([=]() {
			if (is_legacy())
			{
				statement(to_expression(subpass_var->self), " = ", "gl_LastFragData[",
				          get_decoration(output_var->self, DecorationLocation), "];");
			}
			else
			{
				uint32_t num_rt_components = this->get<SPIRType>(output_var->basetype).vecsize;
				statement(to_expression(subpass_var->self), vector_swizzle(num_rt_components, 0), " = ",
				          to_expression(output_var->self), ";");
			}
		});
	}
}